

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 uVar5;
  long lVar6;
  char *__s;
  FILE *pFVar7;
  size_t sVar8;
  char *__s2;
  undefined8 *puVar9;
  char *local_48;
  char *s2;
  char *fname;
  CMimeMessage_T *msg;
  
  fname = (char *)cmime_message_new();
  local_48 = (char *)0x0;
  s2 = (char *)0x0;
  if (argc == 2) {
    s2 = strdup(argv[1]);
    uVar1 = cmime_message_from_file(&fname,s2,1);
    if (uVar1 == 0) {
      puts("Message summary:\n=========================================");
      pvVar4 = (void *)cmime_message_get_sender_string(fname);
      local_48 = (char *)cmime_string_strip(pvVar4);
      printf("Sender: [%s]\n",local_48);
      free(pvVar4);
      printf("Recipients (%d):\n",(ulong)**(uint **)(fname + 8));
      for (puVar9 = *(undefined8 **)(*(long *)(fname + 8) + 0x10); puVar9 != (undefined8 *)0x0;
          puVar9 = (undefined8 *)puVar9[2]) {
        pvVar4 = (void *)cmime_address_to_string(*puVar9);
        local_48 = (char *)cmime_string_strip(pvVar4);
        printf("- [%s]\n",local_48);
        free(pvVar4);
      }
      uVar5 = cmime_message_get_mime_version(fname);
      printf("Mime Version: [%s]\n",uVar5);
      uVar5 = cmime_message_get_content_id(fname);
      printf("Content ID: [%s]\n",uVar5);
      uVar5 = cmime_message_get_content_type(fname);
      printf("Content Type: [%s]\n",uVar5);
      printf("Number of message headers: [%d]\n",(ulong)**(uint **)(fname + 0x10));
      printf("Number of mime parts: [%d]\n",(ulong)**(uint **)(fname + 0x28));
      printf("Message boundary: [%s]\n",*(undefined8 *)(fname + 0x18));
      puts("=========================================\n");
      pvVar4 = (void *)cmime_message_to_string(fname);
      printf("%s",pvVar4);
      free(pvVar4);
    }
    else {
      printf("failed to parse file [%s] [%d]\n",s2,(ulong)uVar1);
    }
    free(s2);
    cmime_message_free(fname);
    iVar2 = 0;
  }
  else {
    cmime_message_set_sender(fname,addr_string1);
    pcVar3 = (char *)cmime_message_get_sender_string(fname);
    iVar2 = strcmp(pcVar3,addr_string1);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,addr_string1)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x70,"int main(int, const char **)");
    }
    free(pcVar3);
    cmime_message_set_sender(fname,addr_string2);
    pcVar3 = (char *)cmime_message_get_sender_string(fname);
    iVar2 = strcmp(pcVar3,addr_string2);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,addr_string2)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x76,"int main(int, const char **)");
    }
    free(pcVar3);
    cmime_message_set_sender_encode(fname,addr_string3);
    pcVar3 = (char *)cmime_message_get_sender_string(fname);
    iVar2 = strcmp(pcVar3,addr_string3_full_encoded);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,addr_string3_full_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x7c,"int main(int, const char **)");
    }
    free(pcVar3);
    cmime_message_set_message_id(fname,message_id_string);
    pcVar3 = (char *)cmime_message_get_message_id(fname);
    iVar2 = strcmp(pcVar3,message_id_string_out);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,message_id_string_out)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x82,"int main(int, const char **)");
    }
    cmime_message_set_subject(fname,"A subject  ");
    pcVar3 = (char *)cmime_message_get_subject(fname);
    iVar2 = strcmp(pcVar3,"A subject");
    if (iVar2 != 0) {
      __assert_fail("strcmp(s, \"A subject\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x86,"int main(int, const char **)");
    }
    cmime_message_set_subject_encode(fname,mime_header_string1);
    pcVar3 = (char *)cmime_message_get_subject(fname);
    iVar2 = strcmp(pcVar3,mime_header_string1_b64_encoded);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,mime_header_string1_b64_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x8a,"int main(int, const char **)");
    }
    iVar2 = cmime_message_set_header(fname,header_string1);
    if (iVar2 == 0) {
      uVar5 = cmime_message_get_header(fname,header_string1_key);
      pcVar3 = (char *)cmime_header_get_value(uVar5,0);
      iVar2 = strcmp(pcVar3,header_string1_value);
      if (iVar2 != 0) {
        __assert_fail("strcmp(cmime_header_get_value(h,0),header_string1_value)==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                      ,0x90,"int main(int, const char **)");
      }
      iVar2 = cmime_message_set_header(fname,header_string1_2);
      if (iVar2 == 0) {
        uVar5 = cmime_message_get_header(fname,header_string1_key);
        pcVar3 = (char *)cmime_header_get_value(uVar5,0);
        iVar2 = strcmp(pcVar3,header_string2_value);
        if (iVar2 != 0) {
          __assert_fail("strcmp(cmime_header_get_value(h,0),header_string2_value)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                        ,0x97,"int main(int, const char **)");
        }
        uVar5 = cmime_message_get_header(fname,header_string1_key_lower);
        pcVar3 = (char *)cmime_header_get_value(uVar5,0);
        iVar2 = strcmp(pcVar3,header_string2_value);
        if (iVar2 != 0) {
          __assert_fail("strcmp(cmime_header_get_value(h,0),header_string2_value)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                        ,0x9b,"int main(int, const char **)");
        }
        iVar2 = cmime_message_add_recipient(fname,addr_string1,0);
        if (((iVar2 == 0) && (iVar2 = cmime_message_add_recipient(fname,addr_string2,1), iVar2 == 0)
            ) && (iVar2 = cmime_message_add_recipient_encode(fname,addr_string3,0), iVar2 == 0)) {
          lVar6 = *(long *)(fname + 8);
          if (lVar6 == 0) {
            __assert_fail("recipient_list",
                          "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                          ,0xa8,"int main(int, const char **)");
          }
          if (*(undefined8 **)(lVar6 + 0x18) != (undefined8 *)0x0) {
            pcVar3 = (char *)cmime_address_to_string(**(undefined8 **)(lVar6 + 0x18));
            iVar2 = strcmp(pcVar3,addr_string3_full_encoded);
            if (iVar2 != 0) {
              __assert_fail("strcmp(s,addr_string3_full_encoded)==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xad,"int main(int, const char **)");
            }
            free(pcVar3);
          }
          for (puVar9 = *(undefined8 **)(lVar6 + 0x10); puVar9 != (undefined8 *)0x0;
              puVar9 = (undefined8 *)puVar9[2]) {
            pvVar4 = (void *)cmime_address_to_string(*puVar9);
            if (pvVar4 == (void *)0x0) {
              __assert_fail("s",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xb4,"int main(int, const char **)");
            }
            free(pvVar4);
          }
          iVar2 = cmime_message_set_date_now(fname);
          if (iVar2 == 0) {
            lVar6 = cmime_message_get_date(fname);
            if (lVar6 == 0) {
              __assert_fail("s",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xbe,"int main(int, const char **)");
            }
            pcVar3 = (char *)cmime_message_generate_boundary();
            cmime_message_set_boundary(fname,pcVar3);
            local_48 = *(char **)(fname + 0x18);
            iVar2 = strcmp(pcVar3,local_48);
            if (iVar2 != 0) {
              __assert_fail("strcmp(s,s2)==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xc4,"int main(int, const char **)");
            }
            free(pcVar3);
            cmime_message_free(fname);
            lVar6 = 0;
            while( true ) {
              pcVar3 = test_files[0] + lVar6;
              printf("Checking sample message [%s]...",pcVar3);
              fname = (char *)cmime_message_new();
              asprintf(&s2,"%s/%s","samples",pcVar3);
              iVar2 = cmime_message_from_file(&fname,s2,0);
              if (iVar2 != 0) {
                return iVar2;
              }
              __s = (char *)cmime_message_to_string(fname);
              pFVar7 = fopen(s2,"rb");
              if (pFVar7 == (FILE *)0x0) break;
              free(s2);
              iVar2 = fseek(pFVar7,0,2);
              if (iVar2 != 0) break;
              sVar8 = ftell(pFVar7);
              rewind(pFVar7);
              __s2 = (char *)calloc(1,sVar8 + 1);
              fread(__s2,sVar8,1,pFVar7);
              iVar2 = ferror(pFVar7);
              if (iVar2 != 0) break;
              fclose(pFVar7);
              asprintf(&local_48,"out_%s",pcVar3);
              pFVar7 = fopen(local_48,"wb");
              sVar8 = strlen(__s);
              fwrite(__s,sVar8,1,pFVar7);
              fclose(pFVar7);
              free(local_48);
              iVar2 = strcmp(__s,__s2);
              if (iVar2 != 0) {
                __assert_fail("strcmp(msg_string,s)==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                              ,0xe9,"int main(int, const char **)");
              }
              free(__s2);
              free(__s);
              cmime_message_free(fname);
              puts("passed!");
              lVar6 = lVar6 + 10;
              if (lVar6 == 0x21c) {
                return 0;
              }
            }
          }
        }
      }
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main (int argc, char const *argv[]) {
    CMimeMessage_T *msg = cmime_message_new();
    char *s = NULL;
    char *s2 = NULL;
    char *msg_string = NULL;
    char *fname = NULL;
    CMimeHeader_T *h = NULL;
    CMimeList_T *recipient_list = NULL;
    CMimeListElem_T *elem;
    CMimeAddress_T *ca = NULL;
    int retval = 0;
    FILE *fp = NULL;
    FILE *fp2 = NULL;
    long size = 0;
    int i = 0;

    if (argc == 2) {
        /* use message path from command line argument */
        fname = strdup(argv[1]);
        i = cmime_message_from_file(&msg,fname,1);
          
        if (i == 0) {
        
            printf("Message summary:\n=========================================\n");
            s = cmime_message_get_sender_string(msg);
            s2 = cmime_string_strip(s);
            printf("Sender: [%s]\n",s2);
            free(s);
            printf("Recipients (%d):\n",msg->recipients->size);
            elem = cmime_list_head(msg->recipients);
            while(elem != NULL) {
                ca = (CMimeAddress_T *)cmime_list_data(elem);
                s = cmime_address_to_string(ca);
                s2 = cmime_string_strip(s);
                printf("- [%s]\n",s2);
                free(s);
                elem = elem->next;
            }
            printf("Mime Version: [%s]\n",cmime_message_get_mime_version(msg));
            printf("Content ID: [%s]\n",cmime_message_get_content_id(msg));
            printf("Content Type: [%s]\n",cmime_message_get_content_type(msg));
            printf("Number of message headers: [%d]\n",msg->headers->size);
            printf("Number of mime parts: [%d]\n",cmime_message_part_count(msg));
            printf("Message boundary: [%s]\n",cmime_message_get_boundary(msg));
            printf("=========================================\n\n");

            msg_string = cmime_message_to_string(msg);
            printf("%s",msg_string);
            free(msg_string);
        } else {
            printf("failed to parse file [%s] [%d]\n",fname,i);
        } 
        free(fname);
        cmime_message_free(msg);
    } else {
        /* loop test_files */
        cmime_message_set_sender(msg,addr_string1);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string1)==0);
        free(s);
        
        // check if sender will be overwritten
        cmime_message_set_sender(msg,addr_string2);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string2)==0);
        free(s);
        
        // check mime sender header
        cmime_message_set_sender_encode(msg,addr_string3);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string3_full_encoded)==0);
        free(s);

        // set message id
        cmime_message_set_message_id(msg,message_id_string);
        s = cmime_message_get_message_id(msg);
        assert(strcmp(s,message_id_string_out)==0);
        
        cmime_message_set_subject(msg, "A subject  "); // IMPORTANT: with whitespaces!
        s = cmime_message_get_subject(msg);
        assert(strcmp(s, "A subject") == 0);
        
        cmime_message_set_subject_encode(msg,mime_header_string1);
        s = cmime_message_get_subject(msg);
        assert(strcmp(s,mime_header_string1_b64_encoded)==0);

        // set a test header
        if (cmime_message_set_header(msg, header_string1)!=0) 
            return(-1);
        h = cmime_message_get_header(msg,header_string1_key);
        assert(strcmp(cmime_header_get_value(h,0),header_string1_value)==0);
        
        // overwrite header
        if (cmime_message_set_header(msg, header_string1_2)!=0)
            return(-1);
            
        h = cmime_message_get_header(msg,header_string1_key);
        assert(strcmp(cmime_header_get_value(h,0),header_string2_value)==0);

        // check with lower case key
        h = cmime_message_get_header(msg,header_string1_key_lower);
        assert(strcmp(cmime_header_get_value(h,0),header_string2_value)==0);

        // check recipients
        if (cmime_message_add_recipient(msg,addr_string1,CMIME_ADDRESS_TYPE_TO)!=0)
            return(-1);
        
        if (cmime_message_add_recipient(msg,addr_string2,CMIME_ADDRESS_TYPE_CC)!=0)
            return(-1);
            
        if (cmime_message_add_recipient_encode(msg,addr_string3,CMIME_ADDRESS_TYPE_TO)!=0)
            return(-1);

        recipient_list = cmime_message_get_recipients(msg);
        assert(recipient_list);

        elem = cmime_list_tail(recipient_list);
        if (elem != NULL) {
            s = cmime_address_to_string((CMimeAddress_T *)cmime_list_data(elem));
            assert(strcmp(s,addr_string3_full_encoded)==0);
            free(s);
        }

        elem = cmime_list_head(recipient_list);
        while(elem != NULL) {
            s = cmime_address_to_string((CMimeAddress_T *)cmime_list_data(elem));
            assert(s);
            free(s);
            elem = elem->next;
        }
        
        // checking date
        if (cmime_message_set_date_now(msg)!=0)
            return(-1);
            
        s = cmime_message_get_date(msg);
        assert(s);
                
        // check boundary stuff
        s = cmime_message_generate_boundary();
        cmime_message_set_boundary(msg,s);
        s2 = cmime_message_get_boundary(msg);
        assert(strcmp(s,s2)==0);
        
        free(s);
        cmime_message_free(msg);


        for (i=0; i < 54; i++) {
            printf("Checking sample message [%s]...", test_files[i]);
            
            msg = cmime_message_new();
            asprintf(&fname,"%s/%s",SAMPLES_DIR,test_files[i]);
            retval = cmime_message_from_file(&msg,fname,0);
            if (retval != 0)
                return retval;
                
            msg_string = cmime_message_to_string(msg);
        
            if ((fp = fopen(fname, "rb")) == NULL) 
                return(-1);
            free(fname);    

            if (fseek(fp, 0, SEEK_END)!=0)
                return(-1);
            
            size = ftell(fp);
            rewind(fp); 
            s = (char*) calloc(sizeof(char), size + sizeof(char));
            fread(s, size, 1, fp);
            if(ferror(fp))
                return(-1);
            
            fclose(fp);
            asprintf(&s2,"out_%s",test_files[i]);
            fp2 = fopen(s2,"wb");
            fwrite(msg_string,strlen(msg_string),1,fp2);
            fclose(fp2);
            free(s2);
            assert(strcmp(msg_string,s)==0);
            free(s);
            free(msg_string);
            cmime_message_free(msg);
            printf("passed!\n");
        }
    }
    return(0);
}